

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutApi.c
# Opt level: O0

void Cut_NodeFreeCuts(Cut_Man_t *p,int Node)

{
  Cut_Cut_t *local_40;
  Cut_Cut_t *local_38;
  Cut_Cut_t *local_30;
  Cut_Cut_t *pCut2;
  Cut_Cut_t *pCut;
  Cut_Cut_t *pList;
  int Node_local;
  Cut_Man_t *p_local;
  
  pCut2 = Cut_NodeReadCutsNew(p,Node);
  if (pCut2 != (Cut_Cut_t *)0x0) {
    if (pCut2 == (Cut_Cut_t *)0x0) {
      local_38 = (Cut_Cut_t *)0x0;
    }
    else {
      local_38 = pCut2->pNext;
    }
    local_30 = local_38;
    while (pCut2 != (Cut_Cut_t *)0x0) {
      Cut_CutRecycle(p,pCut2);
      pCut2 = local_30;
      if (local_30 == (Cut_Cut_t *)0x0) {
        local_40 = (Cut_Cut_t *)0x0;
      }
      else {
        local_40 = local_30->pNext;
      }
      local_30 = local_40;
    }
    Cut_NodeWriteCutsNew(p,Node,(Cut_Cut_t *)0x0);
  }
  return;
}

Assistant:

void Cut_NodeFreeCuts( Cut_Man_t * p, int Node )
{
    Cut_Cut_t * pList, * pCut, * pCut2;
    pList = Cut_NodeReadCutsNew( p, Node );
    if ( pList == NULL )
        return;
    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        Cut_CutRecycle( p, pCut );
    Cut_NodeWriteCutsNew( p, Node, NULL );
}